

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::Test::RecordProperty(string *key,int value)

{
  char *pcVar1;
  allocator local_71;
  string local_70;
  string local_50;
  Message local_20;
  Message value_message;
  int value_local;
  string *key_local;
  
  value_message.ss_.ptr_._4_4_ = value;
  Message::Message(&local_20);
  Message::operator<<(&local_20,(int *)((long)&value_message.ss_.ptr_ + 4));
  Message::GetString_abi_cxx11_(&local_70,&local_20);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar1,&local_71);
  RecordProperty(key,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_70);
  Message::~Message((Message *)0x1b4811);
  return;
}

Assistant:

void Test::RecordProperty(const std::string& key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}